

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordlist.c
# Opt level: O0

size_t wordlist_lookup_word(words *w,char *word)

{
  int iVar1;
  size_t local_40;
  ulong local_30;
  size_t i;
  char **found;
  size_t size;
  char *word_local;
  words *w_local;
  
  i = 0;
  if ((w->sorted & 1U) == 0) {
    for (local_30 = 0; local_30 < w->len && i == 0; local_30 = local_30 + 1) {
      iVar1 = strcmp(word,w->indices[local_30]);
      if (iVar1 == 0) {
        i = (size_t)(w->indices + local_30);
      }
    }
  }
  else {
    i = (size_t)bsearch(word,w->indices,w->len,8,bstrcmp);
  }
  if (i == 0) {
    local_40 = 0;
  }
  else {
    local_40 = ((long)(i - (long)w->indices) >> 3) + 1;
  }
  return local_40;
}

Assistant:

size_t wordlist_lookup_word(const struct words *w, const char *word)
{
    const size_t size = sizeof(const char *);
    const char **found = NULL;

    if (w->sorted)
        found = (const char **)bsearch(word, w->indices, w->len, size, bstrcmp);
    else {
        size_t i;
        for (i = 0; i < w->len && !found; ++i)
            if (!strcmp(word, w->indices[i]))
                found = w->indices + i;
    }
    return found ? found - w->indices + 1u : 0u;
}